

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::GenerateClearBit_abi_cxx11_(int bitIndex)

{
  char *pcVar1;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string mask;
  int bitInVarIndex;
  string varName;
  string *result;
  int in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [35];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [36];
  int local_34;
  string local_30 [36];
  int local_c;
  
  __lhs = in_RDI;
  local_c = in_ESI;
  GetBitFieldNameForBit_abi_cxx11_(in_stack_fffffffffffffeec);
  local_34 = local_c % 0x20;
  pcVar1 = *(char **)(bit_masks + (long)local_34 * 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar1,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_6d = 0;
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  local_6d = 1;
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_30);
  return __lhs;
}

Assistant:

std::string GenerateClearBit(int bitIndex) {
  std::string varName = GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = varName + " = (" + varName + " & ~" + mask + ")";
  return result;
}